

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscCompiler.cpp
# Opt level: O2

void __thiscall
NscCompiler::NscCompiler
          (NscCompiler *this,ResourceManager *ResMan,bool EnableExtensions,bool SaveSymbolTable)

{
  _Rb_tree_header *p_Var1;
  NscCompilerState *this_00;
  
  CNwnLoader::CNwnLoader(&this->super_CNwnLoader);
  (this->super_CNwnLoader)._vptr_CNwnLoader = (_func_int **)&PTR_LoadResource_0019fd98;
  this->m_ResourceManager = ResMan;
  this->m_StrictModeEnabled = false;
  this->m_EnableExtensions = EnableExtensions;
  this->m_ShowIncludes = false;
  this->m_GenerateMakeDeps = false;
  this->m_SuppressWarnings = false;
  this->m_ShowPreprocessed = false;
  this->m_ShowPreprocessed = false;
  this->m_Initialized = false;
  this->m_NWScriptParsed = false;
  this->m_SymbolTableReady = false;
  this_00 = (NscCompilerState *)operator_new(0x958);
  NscCompilerState::NscCompilerState(this_00);
  this->m_CompilerState = this_00;
  (this->m_IncludePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_IncludePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_IncludePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ResLoadContext = (void *)0x0;
  this->m_ResLoadFile = (ResLoadFileProc)0x0;
  this->m_ResUnloadFile = (ResUnloadFileProc)0x0;
  this->m_CacheResources = true;
  (this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_ResourceCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_ErrorOutput = (IDebugTextOut *)0x0;
  this_00->m_fSaveSymbolTable = SaveSymbolTable;
  return;
}

Assistant:

NscCompiler::NscCompiler (
	 ResourceManager & ResMan,
	 bool EnableExtensions,
	 bool SaveSymbolTable
	)
: m_ResourceManager (ResMan),
  m_EnableExtensions (EnableExtensions),
  m_ShowIncludes (false),
  m_ShowPreprocessed(false),
  m_GenerateMakeDeps(false),
  m_StrictModeEnabled(false),
  m_SuppressWarnings(false),
  m_Initialized (false),
  m_NWScriptParsed (false),
  m_SymbolTableReady (false),
  m_CompilerState (new NscCompilerState ()),
  m_ResLoadContext (NULL),
  m_ResLoadFile (NULL),
  m_ResUnloadFile (NULL),
  m_CacheResources (true),
  m_ErrorOutput (NULL)
{
	m_CompilerState ->m_fSaveSymbolTable = SaveSymbolTable;
}